

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O1

bool __thiscall
jsoncons::typed_array_visitor<std::vector<short,_std::allocator<short>_>_>::visit_uint64
          (typed_array_visitor<std::vector<short,_std::allocator<short>_>_> *this,uint64_t value,
          semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  vector<short,_std::allocator<short>_> *this_00;
  iterator __position;
  short local_2;
  
  this_00 = this->v_;
  __position._M_current =
       (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
              (this_00,__position,&local_2);
  }
  else {
    *__position._M_current = (short)value;
    (this_00->super__Vector_base<short,_std::allocator<short>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t value, 
            semantic_tag, 
            const ser_context&,
            std::error_code&) override
        {
            v_.push_back(static_cast<value_type>(value));
            JSONCONS_VISITOR_RETURN;
        }